

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

void __thiscall MPLSParser::parsePlayListMark(MPLSParser *this,uint8_t *buffer,int len)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  unsigned_short ref_to_PlayItem_id;
  uint32_t mark_time_stamp;
  vector<PlayListMark,std::allocator<PlayListMark>> *local_58;
  BitStreamReader reader;
  
  reader.super_BitStream.m_totalBits = 0;
  reader.m_curVal = 0;
  reader.m_bitLeft = 0;
  reader.super_BitStream.m_buffer = (uint *)0x0;
  reader.super_BitStream.m_initBuffer = (uint *)0x0;
  BitStreamReader::setBuffer(&reader,buffer,buffer + len);
  BitStreamReader::skipBits(&reader,0x20);
  uVar1 = BitStreamReader::getBits(&reader,0x10);
  uVar1 = uVar1 & 0xffff;
  local_58 = (vector<PlayListMark,std::allocator<PlayListMark>> *)&this->m_marks;
  while (bVar4 = uVar1 != 0, uVar1 = uVar1 - 1, bVar4) {
    BitStreamReader::skipBits(&reader,8);
    uVar2 = BitStreamReader::getBits(&reader,8);
    uVar3 = BitStreamReader::getBits(&reader,0x10);
    ref_to_PlayItem_id = (unsigned_short)uVar3;
    mark_time_stamp = BitStreamReader::getBits(&reader,0x20);
    BitStreamReader::skipBits(&reader,0x10);
    BitStreamReader::skipBits(&reader,0x20);
    if ((char)uVar2 == '\x01') {
      std::vector<PlayListMark,std::allocator<PlayListMark>>::
      emplace_back<unsigned_short_const&,unsigned_int_const&>
                (local_58,&ref_to_PlayItem_id,&mark_time_stamp);
    }
  }
  return;
}

Assistant:

void MPLSParser::parsePlayListMark(uint8_t* buffer, const int len)
{
    BitStreamReader reader{};
    reader.setBuffer(buffer, buffer + len);
    reader.skipBits(32);  // length
    const auto number_of_PlayList_marks = reader.getBits<uint16_t>(16);
    for (int PL_mark_id = 0; PL_mark_id < number_of_PlayList_marks; PL_mark_id++)
    {
        reader.skipBits(8);  // reserved_for_future_use
        const auto mark_type = reader.getBits<uint8_t>(8);
        const auto ref_to_PlayItem_id = reader.getBits<uint16_t>(16);
        const uint32_t mark_time_stamp = reader.getBits(32);
        reader.skipBits(16);  // entry_ES_PID
        reader.skipBits(32);  // duration
        if (mark_type == 1)   // mark_type 0x01 = Chapter search
            m_marks.emplace_back(ref_to_PlayItem_id, mark_time_stamp);
    }
}